

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O2

int luaU_dump(lua_State *L,Proto *f,lua_Writer w,void *data,int strip)

{
  DumpState local_38;
  
  local_38.L = L;
  local_38.writer = w;
  local_38.data = data;
  local_38.strip = strip;
  local_38.status = (*w)(L,"\x1bLua",4,data);
  dumpByte(&local_38,0x54);
  dumpByte(&local_38,0);
  if (local_38.status == 0) {
    local_38.status = (*local_38.writer)(local_38.L,anon_var_dwarf_e27c,6,local_38.data);
  }
  dumpByte(&local_38,4);
  dumpByte(&local_38,8);
  dumpByte(&local_38,8);
  dumpInteger(&local_38,0x5678);
  dumpNumber(&local_38,370.5);
  dumpByte(&local_38,f->sizeupvalues);
  dumpFunction(&local_38,f,(TString *)0x0);
  return local_38.status;
}

Assistant:

int luaU_dump(lua_State *L, const Proto *f, lua_Writer w, void *data,
              int strip) {
  DumpState D;
  D.L = L;
  D.writer = w;
  D.data = data;
  D.strip = strip;
  D.status = 0;
  dumpHeader(&D);
  dumpByte(&D, f->sizeupvalues);
  dumpFunction(&D, f, NULL);
  return D.status;
}